

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O3

void __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
PrecomputedScalarReferenceFiniteElement
          (PrecomputedScalarReferenceFiniteElement<double> *this,
          ScalarReferenceFiniteElement<double> *fe,QuadRule *qr)

{
  MatrixXd *pMVar1;
  undefined3 uVar2;
  quadDegree_t qVar3;
  
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__PrecomputedScalarReferenceFiniteElement_004930d0;
  this->fe_ = fe;
  uVar2 = *(undefined3 *)&qr->field_0x1;
  qVar3 = qr->degree_;
  (this->qr_).ref_el_ = (RefEl)(qr->ref_el_).type_;
  *(undefined3 *)&(this->qr_).field_0x1 = uVar2;
  (this->qr_).degree_ = qVar3;
  pMVar1 = &(this->qr_).points_;
  (this->qr_).points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->qr_).points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  (this->qr_).points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
  (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (qr->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->qr_).weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (qr->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->qr_).weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = (qr->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  (qr->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (qr->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (*this->fe_->_vptr_ScalarReferenceFiniteElement[7])(&this->shap_fun_,this->fe_,pMVar1);
  (*this->fe_->_vptr_ScalarReferenceFiniteElement[8])(&this->grad_shape_fun_,this->fe_,pMVar1);
  return;
}

Assistant:

PrecomputedScalarReferenceFiniteElement(
      lf::fe::ScalarReferenceFiniteElement<SCALAR> const* fe, quad::QuadRule qr)
      : lf::fe::ScalarReferenceFiniteElement<SCALAR>(),
        fe_(fe),
        qr_(std::move(qr)),
        shap_fun_(fe_->EvalReferenceShapeFunctions(qr_.Points())),
        grad_shape_fun_(fe_->GradientsReferenceShapeFunctions(qr_.Points())) {}